

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

bool __thiscall Js::JavascriptSet::TryAddToIntSet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex i;
  undefined4 *puVar4;
  Var aValue;
  Recycler *recycler;
  Var local_28;
  Var taggedInt;
  
  if (this->kind != IntSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x168,"(this->kind == SetKind::IntSet)",
                                "this->kind == SetKind::IntSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  aValue = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,false>(value);
  if (aValue != (Var)0x0) {
    local_28 = aValue;
    i = TaggedInt::ToInt32(aValue);
    BVar3 = BVSparse<Memory::Recycler>::TestAndSet((BVSparse<Memory::Recycler> *)this->u,i);
    if (BVar3 == '\0') {
      recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
      MapOrSetDataList<void_*>::Append(&this->list,&local_28,recycler);
    }
  }
  return aValue != (Var)0x0;
}

Assistant:

bool
JavascriptSet::TryAddToIntSet(Var value)
{
    Assert(this->kind == SetKind::IntSet);
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, false /* allowLossyConversion */>(value);
    if (!taggedInt)
    {
        return false;
    }

    int32 intVal = TaggedInt::ToInt32(taggedInt);
    if (!this->u.intSet->TestAndSet(intVal))
    {
        this->list.Append(taggedInt, this->GetRecycler());
    }
    return true;
}